

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmHttpSplitURI(SyhttpUri *pOut,char *zUri,sxu32 nLen)

{
  int *piVar1;
  char cVar2;
  char cVar3;
  sxi32 sVar4;
  sxi32 sVar5;
  ulong uVar6;
  ushort **ppuVar7;
  long lVar8;
  uint uVar9;
  sxu32 sVar10;
  sxu32 nLen_00;
  int iVar11;
  int iVar12;
  char *pcVar14;
  bool bVar15;
  sxu32 nPos;
  sxu32 nPassOfft;
  sxu32 local_54;
  long local_50;
  char *local_48;
  ulong local_40;
  uint local_34;
  char *pcVar13;
  
  local_48 = zUri + nLen;
  local_54 = 0;
  uVar6 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&(pOut->sHost).zString + uVar6 + 4) = 0;
    uVar6 = uVar6 + 4;
  } while (uVar6 < 0x8c);
  (pOut->sRaw).zString = zUri;
  (pOut->sRaw).nByte = nLen;
  if (nLen != 0) {
    uVar9 = nLen - 1;
    pcVar13 = (pOut->sRaw).zString;
    do {
      cVar2 = *pcVar13;
      if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
         (ppuVar7 = __ctype_b_loc(), (*(byte *)((long)*ppuVar7 + (long)cVar2 * 2 + 1) & 0x20) == 0))
      break;
      (pOut->sRaw).nByte = uVar9;
      (pOut->sRaw).zString = pcVar13 + 1;
      bVar15 = uVar9 != 0;
      uVar9 = uVar9 - 1;
      pcVar13 = pcVar13 + 1;
    } while (bVar15);
  }
  uVar9 = (pOut->sRaw).nByte;
  if (uVar9 != 0) {
    pcVar13 = (pOut->sRaw).zString;
    while( true ) {
      uVar9 = uVar9 - 1;
      uVar6 = (ulong)pcVar13[uVar9];
      if (0xffffffffffffffbf < uVar6) break;
      ppuVar7 = __ctype_b_loc();
      if (((*(byte *)((long)*ppuVar7 + uVar6 * 2 + 1) & 0x20) == 0) ||
         ((pOut->sRaw).nByte = uVar9, uVar9 == 0)) break;
    }
  }
  sVar4 = SyByteFind(zUri,nLen,0x2f,&local_54);
  local_50 = CONCAT44(local_50._4_4_,sVar4);
  pcVar14 = local_48;
  pcVar13 = local_48;
  if (sVar4 == 0) {
    local_40 = (ulong)local_54;
    pcVar13 = zUri + local_40;
    if ((local_40 != 0) && (pcVar13[-1] == ':')) {
      (pOut->sScheme).zString = zUri;
      (pOut->sScheme).nByte = local_54 - 1;
      if (local_54 - 1 != 0) {
        uVar9 = local_54 - 2;
        pcVar14 = (pOut->sScheme).zString;
        do {
          cVar2 = *pcVar14;
          if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
             (ppuVar7 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar7 + (long)cVar2 * 2 + 1) & 0x20) == 0)) break;
          (pOut->sScheme).nByte = uVar9;
          (pOut->sScheme).zString = pcVar14 + 1;
          bVar15 = uVar9 != 0;
          uVar9 = uVar9 - 1;
          pcVar14 = pcVar14 + 1;
        } while (bVar15);
      }
    }
    pcVar14 = local_48;
    iVar11 = (int)local_48;
    if (pcVar13[1] == '/') {
      zUri = pcVar13 + 2;
      sVar4 = SyByteFind(zUri,iVar11 - (int)zUri,0x2f,&local_54);
      pcVar13 = pcVar14;
      if (sVar4 == 0) {
        pcVar13 = zUri + local_54;
      }
    }
    else if (((int)local_40 == 0) || (pcVar13[-1] == ':')) goto LAB_0012315f;
  }
  iVar11 = (int)pcVar14;
  iVar12 = (int)pcVar13;
  nLen_00 = iVar12 - (int)zUri;
  sVar4 = SyByteFind(zUri,nLen_00,0x40,&local_54);
  sVar10 = local_54;
  if (sVar4 == 0) {
    if (local_54 == 0) {
      zUri = zUri + 1;
    }
    else {
      (pOut->sUser).zString = zUri;
      (pOut->sUser).nByte = local_54;
      sVar4 = SyByteFind(zUri,nLen_00,0x3a,&local_34);
      if ((sVar4 == 0) && (local_34 < sVar10)) {
        (pOut->sUser).nByte = local_34;
        (pOut->sPass).zString = zUri + (ulong)local_34 + 1;
        (pOut->sPass).nByte = ~local_34 + sVar10;
      }
      zUri = zUri + (sVar10 + 1);
    }
  }
  pcVar14 = zUri;
  if (zUri < pcVar13) {
    ppuVar7 = __ctype_b_loc();
    lVar8 = (long)pcVar13 - (long)zUri;
    do {
      pcVar14 = zUri;
      if ((*(byte *)((long)*ppuVar7 + (long)*zUri * 2 + 1) & 0x20) == 0) break;
      zUri = zUri + 1;
      lVar8 = lVar8 + -1;
      pcVar14 = pcVar13;
    } while (lVar8 != 0);
  }
  (pOut->sHost).zString = pcVar14;
  (pOut->sHost).nByte = iVar12 - (int)pcVar14;
  cVar2 = *pcVar14;
  if (cVar2 == '[') {
    (pOut->sHost).zString = pcVar14 + 1;
    pcVar14 = pcVar14 + 2;
    uVar9 = 0;
    while( true ) {
      (pOut->sHost).nByte = uVar9;
      cVar3 = pcVar14[-1];
      if (((0xffffffffffffffbf < (ulong)(long)cVar3) ||
          (ppuVar7 = __ctype_b_loc(), (*(byte *)((long)*ppuVar7 + (long)cVar3 * 2 + 1) & 0x10) == 0)
          ) && (cVar3 != ':')) break;
      uVar9 = uVar9 + 1;
      pcVar14 = pcVar14 + 1;
    }
    if (cVar3 != ']') {
      return -0x18;
    }
    iVar11 = (int)local_48;
  }
  sVar4 = SyByteFind(pcVar14,iVar12 - (int)pcVar14,0x3a,&local_54);
  if (sVar4 == 0) {
    if (cVar2 != '[') {
      (pOut->sHost).nByte = local_54;
    }
    (pOut->sPort).zString = pcVar14 + (local_54 + 1);
    (pOut->sPort).nByte = iVar12 - (int)(pcVar14 + (local_54 + 1));
  }
  if ((int)local_50 != 0) {
    return 0;
  }
LAB_0012315f:
  (pOut->sPath).zString = pcVar13;
  sVar10 = iVar11 - (int)pcVar13;
  (pOut->sPath).nByte = sVar10;
  if (sVar10 != 0) {
    sVar4 = SyByteFind(pcVar13,sVar10,0x3f,&local_54);
    local_50 = 0x20;
    if (sVar4 == 0) {
      (pOut->sPath).nByte = local_54;
      (pOut->sQuery).zString = pcVar13 + (local_54 + 1);
      (pOut->sQuery).nByte = iVar11 - (int)(pcVar13 + (local_54 + 1));
      local_50 = 0x30;
    }
    sVar5 = SyByteFind(pcVar13,sVar10,0x23,&local_54);
    if (sVar5 == 0) {
      if (sVar4 == 0) {
        if (pcVar13 + local_54 < *(char **)((long)&(pOut->sHost).zString + local_50)) {
          return -0xc;
        }
        piVar1 = (int *)((long)&(pOut->sHost).nByte + local_50);
        *piVar1 = *piVar1 + ((int)(pcVar13 + local_54) - iVar11);
      }
      else {
        *(sxu32 *)((long)&(pOut->sHost).nByte + local_50) = local_54;
      }
      (pOut->sFragment).zString = pcVar13 + (local_54 + 1);
      (pOut->sFragment).nByte = iVar11 - (int)(pcVar13 + (local_54 + 1));
    }
  }
  return 0;
}

Assistant:

static sxi32 VmHttpSplitURI(SyhttpUri *pOut, const char *zUri, sxu32 nLen)
 {
	 const char *zEnd = &zUri[nLen];
	 sxu8 bHostOnly = FALSE;
	 sxu8 bIPv6 = FALSE	; 
	 const char *zCur;
	 SyString *pComp;
	 sxu32 nPos = 0;
	 sxi32 rc;
	 /* Zero the structure first */
	 SyZero(pOut, sizeof(SyhttpUri));
	 /* Remove leading and trailing white spaces  */
	 SyStringInitFromBuf(&pOut->sRaw, zUri, nLen);
	 SyStringFullTrim(&pOut->sRaw);
	 /* Find the first '/' separator */
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc != SXRET_OK ){
		 /* Assume a host name only */
		 zCur = zEnd;
		 bHostOnly = TRUE;
		 goto ProcessHost;
	 }
	 zCur = &zUri[nPos];
	 if( zUri != zCur && zCur[-1] == ':' ){
		 /* Extract a scheme:
		  * Not that we can get an invalid scheme here.
		  * Fortunately the caller can discard any URI by comparing this scheme with its 
		  * registered schemes and will report the error as soon as his comparison function
		  * fail.
		  */
	 	pComp = &pOut->sScheme;
		SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri - 1));
		SyStringLeftTrim(pComp);		
	 }
	 if( zCur[1] != '/' ){
		 if( zCur == zUri || zCur[-1] == ':' ){
		  /* No authority */
		  goto PathSplit;
		}
		 /* There is something here , we will assume its an authority
		  * and someone has forgot the two prefix slashes "//", 
		  * sooner or later we will detect if we are dealing with a malicious
		  * user or not, but now assume we are dealing with an authority
		  * and let the caller handle all the validation process.
		  */
		 goto ProcessHost;
	 }	 
	 zUri = &zCur[2];
	 zCur = zEnd;
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc == SXRET_OK ){
		 zCur = &zUri[nPos];
	 }
 ProcessHost:
	 /* Extract user information if present */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), '@', &nPos);
	 if( rc == SXRET_OK ){
		 if( nPos > 0 ){
			 sxu32 nPassOfft; /* Password offset */
			 pComp = &pOut->sUser;
			 SyStringInitFromBuf(pComp, zUri, nPos);
			 /* Extract the password if available */
			 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPassOfft);
			 if( rc == SXRET_OK && nPassOfft < nPos){
				 pComp->nByte = nPassOfft;
				 pComp = &pOut->sPass;
				 pComp->zString = &zUri[nPassOfft+sizeof(char)];
				 pComp->nByte = nPos - nPassOfft - 1;
			 }
			 /* Update the cursor */
			 zUri = &zUri[nPos+1];
		 }else{
			 zUri++;
		 }
	 }
	 pComp = &pOut->sHost;
	 while( zUri < zCur && SyisSpace(zUri[0])){
		 zUri++;
	 }	
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri));
	 if( pComp->zString[0] == '[' ){
		 /* An IPv6 Address: Make a simple naive test
		  */
		 zUri++; pComp->zString++; pComp->nByte = 0;
		 while( ((unsigned char)zUri[0] < 0xc0 && SyisHex(zUri[0])) || zUri[0] == ':' ){
			 zUri++; pComp->nByte++;
		 }
		 if( zUri[0] != ']' ){
			 return SXERR_CORRUPT; /* Malformed IPv6 address */
		 }
		 zUri++;
		 bIPv6 = TRUE;
	 }
	 /* Extract a port number if available */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPos);
	 if( rc == SXRET_OK ){
		 if( bIPv6 == FALSE ){
			 pComp->nByte = (sxu32)(&zUri[nPos] - zUri);
		 }
		 pComp = &pOut->sPort;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zCur - &zUri[nPos+1]));	
	 }
	 if( bHostOnly == TRUE ){
		 return SXRET_OK;
	 }
PathSplit:
	 zUri = zCur;
	 pComp = &pOut->sPath;
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zEnd-zUri));
	 if( pComp->nByte == 0 ){
		 return SXRET_OK; /* Empty path */
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '?', &nPos) ){
		 pComp->nByte = nPos; /* Update path length */
		 pComp = &pOut->sQuery;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]));
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '#', &nPos) ){
		 /* Update path or query length */
		 if( pComp == &pOut->sPath ){
			 pComp->nByte = nPos;
		 }else{
			 if( &zUri[nPos] < (char *)SyStringData(pComp) ){
				 /* Malformed syntax : Query must be present before fragment */
				 return SXERR_SYNTAX;
			 }
			 pComp->nByte -= (sxu32)(zEnd - &zUri[nPos]);
		 }
		 pComp = &pOut->sFragment;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]))
	 }
	 return SXRET_OK;
 }